

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::CallIExtended
          (ByteCodeWriter *this,OpCode op,RegSlot returnValueRegister,RegSlot functionRegister,
          ArgSlot givenArgCount,CallIExtendedOptions options,void *buffer,uint byteCount,
          ProfileId callSiteId,CallFlags callFlags)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  uint32 local_44;
  bool success_3;
  bool success_2;
  bool success_1;
  bool success;
  uint spreadArgsOffset;
  bool isCallWithICIndex;
  uint uStack_38;
  ProfileId profileId2;
  ProfileId profileId;
  bool isProfiled2;
  bool isProfiled;
  CacheIdUnit unit;
  RegSlot local_24;
  bool hasCallFlags;
  CallIExtendedOptions options_local;
  ArgSlot givenArgCount_local;
  RegSlot functionRegister_local;
  RegSlot returnValueRegister_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  local_24 = functionRegister;
  _hasCallFlags = returnValueRegister;
  functionRegister_local._2_2_ = op;
  _returnValueRegister_local = this;
  CheckOpen(this);
  op_00 = functionRegister_local._2_2_;
  if (callFlags == CallFlags_None) {
    OpLayoutType::OpLayoutType((OpLayoutType *)&unit,CallIExtended);
    CheckOp(this,op_00,(OpLayoutType)unit.cacheId);
  }
  else {
    OpLayoutType::OpLayoutType((OpLayoutType *)&unit.isRootObjectCache,CallIExtendedFlags);
    CheckOp(this,op_00,(OpLayoutType)unit._4_4_);
  }
  bVar2 = OpCodeAttr::HasMultiSizeLayout(functionRegister_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x42a,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (_hasCallFlags != 0xffffffff) {
    _hasCallFlags = ConsumeReg(this,_hasCallFlags);
  }
  local_24 = ConsumeReg(this,local_24);
  CacheIdUnit::CacheIdUnit((CacheIdUnit *)&stack0xffffffffffffffc8);
  uStack_38 = 0xffffffff;
  JsUtil::
  BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::TryGetValueAndRemove
            (this->callRegToLdFldCacheIndexMap,&local_24,(CacheIdUnit *)&stack0xffffffffffffffc8);
  spreadArgsOffset._3_1_ = 0;
  spreadArgsOffset._2_1_ = 0;
  spreadArgsOffset._0_2_ = callSiteId;
  _success_1 = 0xffff;
  bVar2 = DoProfileCallOp(functionRegister_local._2_2_);
  if (bVar2) {
    bVar2 = DoDynamicProfileOpcode(this,InlinePhase,false);
    if ((bVar2) && (callSiteId != 0xffff)) {
      functionRegister_local._2_2_ =
           OpCodeUtil::ConvertCallOpToProfiled(functionRegister_local._2_2_,false);
      spreadArgsOffset._3_1_ = 1;
    }
    else {
      bVar2 = DoDynamicProfileOpcode(this,AggressiveIntTypeSpecPhase,false);
      if (((bVar2) || (bVar2 = DoDynamicProfileOpcode(this,FloatTypeSpecPhase,false), bVar2)) &&
         (bVar2 = FunctionBody::AllocProfiledReturnTypeId
                            (this->m_functionWrite,(ProfileId *)&spreadArgsOffset), bVar2)) {
        functionRegister_local._2_2_ =
             OpCodeUtil::ConvertCallOpToProfiledReturnType(functionRegister_local._2_2_);
        spreadArgsOffset._3_1_ = 1;
      }
    }
  }
  else {
    bVar2 = DoProfileNewScObjArrayOp(this,functionRegister_local._2_2_);
    if ((((bVar2) &&
         ((bVar2 = DoDynamicProfileOpcode(this,NativeArrayPhase,true), bVar2 ||
          (bVar2 = DoDynamicProfileOpcode(this,InlinePhase,true), bVar2)))) &&
        (callSiteId != 0xffff)) &&
       (bVar2 = FunctionBody::AllocProfiledArrayCallSiteId
                          (this->m_functionWrite,(ProfileId *)&success_1), bVar2)) {
      OpCodeUtil::ConvertNonCallOpToProfiled((OpCode *)((long)&functionRegister_local + 2));
      spreadArgsOffset._3_1_ = 1;
      spreadArgsOffset._2_1_ = 1;
    }
    else {
      bVar2 = DoProfileNewScObjectOp(this,functionRegister_local._2_2_);
      if (((bVar2) &&
          ((bVar2 = DoDynamicProfileOpcode(this,InlinePhase,true), bVar2 ||
           (bVar2 = DoDynamicProfileOpcode(this,FixedNewObjPhase,true), bVar2)))) &&
         (callSiteId != 0xffff)) {
        OpCodeUtil::ConvertNonCallOpToProfiled((OpCode *)((long)&functionRegister_local + 2));
        spreadArgsOffset._3_1_ = 1;
      }
    }
  }
  local_44 = 0;
  if ((options & CallIExtended_SpreadArgs) != CallIExtended_None) {
    if ((buffer == (void *)0x0) || (byteCount == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x460,"(buffer != nullptr && byteCount > 0)",
                                  "buffer != nullptr && byteCount > 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    local_44 = InsertAuxiliaryData(this,buffer,byteCount);
  }
  if (callFlags == CallFlags_None) {
    bVar2 = TryWriteCallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,functionRegister_local._2_2_,_hasCallFlags,local_24,givenArgCount,
                       options,local_44);
    if (((!bVar2) &&
        (bVar2 = TryWriteCallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                           (this,functionRegister_local._2_2_,_hasCallFlags,local_24,givenArgCount,
                            options,local_44), !bVar2)) &&
       (bVar2 = TryWriteCallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                          (this,functionRegister_local._2_2_,_hasCallFlags,local_24,givenArgCount,
                           options,local_44), !bVar2)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x477,"(success)","success");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  else {
    bVar2 = TryWriteCallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,functionRegister_local._2_2_,_hasCallFlags,local_24,givenArgCount,
                       options,local_44,callFlags);
    if (((!bVar2) &&
        (bVar2 = TryWriteCallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                           (this,functionRegister_local._2_2_,_hasCallFlags,local_24,givenArgCount,
                            options,local_44,callFlags), !bVar2)) &&
       (bVar2 = TryWriteCallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                          (this,functionRegister_local._2_2_,_hasCallFlags,local_24,givenArgCount,
                           options,local_44,callFlags), !bVar2)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x473,"(success)","success");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  if (((spreadArgsOffset._3_1_ & 1) != 0) &&
     (Data::Encode(&this->m_byteCodeData,&spreadArgsOffset,2), (spreadArgsOffset._2_1_ & 1) != 0)) {
    Data::Encode(&this->m_byteCodeData,&success_1,2);
  }
  return;
}

Assistant:

void ByteCodeWriter::CallIExtended(OpCode op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, CallIExtendedOptions options, const void *buffer, uint byteCount, ProfileId callSiteId, CallFlags callFlags)
    {
        CheckOpen();
        bool hasCallFlags = !(callFlags == CallFlags_None);
        if (hasCallFlags)
        {
            CheckOp(op, OpLayoutType::CallIExtendedFlags);
        }
        else
        {
            CheckOp(op, OpLayoutType::CallIExtended);
        }
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        // givenArgCount could be <, ==, or > than Function's "InParams" count

        if (returnValueRegister != Js::Constants::NoRegister)
        {
            returnValueRegister = ConsumeReg(returnValueRegister);
        }
        functionRegister = ConsumeReg(functionRegister);

        // CallISpread is not going to use the ldFld cache index, but still remove it from the map as we expect
        // the entry for a cache index to be removed once we have seen the corresponding call.
        CacheIdUnit unit;
        unit.cacheId = Js::Constants::NoInlineCacheIndex;
        callRegToLdFldCacheIndexMap->TryGetValueAndRemove(functionRegister, &unit);

        bool isProfiled = false, isProfiled2 = false;
        ProfileId profileId = callSiteId, profileId2 = Constants::NoProfileId;
        bool isCallWithICIndex = false;

        if (DoProfileCallOp(op))
        {
            if (DoDynamicProfileOpcode(InlinePhase) &&
                callSiteId != Js::Constants::NoProfileId)
            {
                op = Js::OpCodeUtil::ConvertCallOpToProfiled(op);
                isProfiled = true;
            }
            else if ((DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) || DoDynamicProfileOpcode(FloatTypeSpecPhase)) &&
                this->m_functionWrite->AllocProfiledReturnTypeId(&profileId))
            {
                op = Js::OpCodeUtil::ConvertCallOpToProfiledReturnType(op);
                isProfiled = true;
            }
        }
        else if (DoProfileNewScObjArrayOp(op) &&
            (DoDynamicProfileOpcode(NativeArrayPhase, true) || DoDynamicProfileOpcode(InlinePhase, true)) &&
            callSiteId != Js::Constants::NoProfileId &&
            this->m_functionWrite->AllocProfiledArrayCallSiteId(&profileId2))
        {
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
            isProfiled = true;
            isProfiled2 = true;
        }
        else if (DoProfileNewScObjectOp(op) && (DoDynamicProfileOpcode(InlinePhase, true) || DoDynamicProfileOpcode(FixedNewObjPhase, true)) &&
            callSiteId != Js::Constants::NoProfileId)
        {
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
            isProfiled = true;
        }

        uint spreadArgsOffset = 0;
        if (options & CallIExtended_SpreadArgs)
        {
            Assert(buffer != nullptr && byteCount > 0);
            spreadArgsOffset = InsertAuxiliaryData(buffer, byteCount);
        }

        if (isCallWithICIndex)
        {
            if (hasCallFlags == true)
            {
                MULTISIZE_LAYOUT_WRITE(CallIExtendedFlagsWithICIndex, op, returnValueRegister, functionRegister, givenArgCount, unit.cacheId, unit.isRootObjectCache, options, spreadArgsOffset, callFlags);
            }
            else
            {
                MULTISIZE_LAYOUT_WRITE(CallIExtendedWithICIndex, op, returnValueRegister, functionRegister, givenArgCount, unit.cacheId, unit.isRootObjectCache, options, spreadArgsOffset);
            }
        }
        else
        {
            if (hasCallFlags == true)
            {
                MULTISIZE_LAYOUT_WRITE(CallIExtendedFlags, op, returnValueRegister, functionRegister, givenArgCount, options, spreadArgsOffset, callFlags);
            }
            else
            {
                MULTISIZE_LAYOUT_WRITE(CallIExtended, op, returnValueRegister, functionRegister, givenArgCount, options, spreadArgsOffset);
            }
        }

        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
            if (isProfiled2)
            {
                m_byteCodeData.Encode(&profileId2, sizeof(Js::ProfileId));
            }
        }
    }